

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

void __thiscall helics::apps::AsioBrokerServer::stopServer(AsioBrokerServer *this)

{
  string_view message;
  string_view message_00;
  undefined4 in_EAX;
  undefined4 in_register_00000004;
  char *unaff_RBX;
  int __fd;
  size_t sVar1;
  
  sVar1 = CONCAT44(in_register_00000004,in_EAX);
  CLI::std::mutex::lock((mutex *)&this->threadGuard);
  if (this->tcp_enabled_ == true) {
    __fd = 0x371fda;
    message._M_str = unaff_RBX;
    message._M_len = sVar1;
    TypedBrokerServer::logMessage(message);
    gmlc::networking::TcpServer::close
              ((this->tcpserver).
               super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               __fd);
  }
  if (this->udp_enabled_ == true) {
    message_00._M_str = unaff_RBX;
    message_00._M_len = sVar1;
    TypedBrokerServer::logMessage(message_00);
    ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
              (&(((this->udpserver).
                  super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mSocket).super_basic_socket<asio::ip::udp,_asio::any_io_executor>);
  }
  std::thread::join();
  pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  return;
}

Assistant:

void AsioBrokerServer::stopServer()
    {
        std::lock_guard<std::mutex> tlock(threadGuard);
        if (tcp_enabled_) {
#ifdef HELICS_ENABLE_TCP_CORE
            logMessage("stopping tcp broker server");
            tcpserver->close();
#endif
        }
        if (udp_enabled_) {
#ifdef HELICS_ENABLE_UDP_CORE
            logMessage("stopping udp broker server");
            udpserver->stop_receive();
#endif
        }
        mainLoopThread.join();
    }